

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::SwapPositionsInSEL(Clipper *this,TEdge *Edge1,TEdge *Edge2)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *Prev_2;
  TEdge *Next_2;
  TEdge *Prev_1;
  TEdge *Next_1;
  TEdge *Prev;
  TEdge *Next;
  TEdge *Edge2_local;
  TEdge *Edge1_local;
  Clipper *this_local;
  
  if (((Edge1->NextInSEL != (TEdge *)0x0) || (Edge1->PrevInSEL != (TEdge *)0x0)) &&
     ((Edge2->NextInSEL != (TEdge *)0x0 || (Edge2->PrevInSEL != (TEdge *)0x0)))) {
    if (Edge1->NextInSEL == Edge2) {
      pTVar1 = Edge2->NextInSEL;
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->PrevInSEL = Edge1;
      }
      pTVar2 = Edge1->PrevInSEL;
      if (pTVar2 != (TEdge *)0x0) {
        pTVar2->NextInSEL = Edge2;
      }
      Edge2->PrevInSEL = pTVar2;
      Edge2->NextInSEL = Edge1;
      Edge1->PrevInSEL = Edge2;
      Edge1->NextInSEL = pTVar1;
    }
    else if (Edge2->NextInSEL == Edge1) {
      pTVar1 = Edge1->NextInSEL;
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->PrevInSEL = Edge2;
      }
      pTVar2 = Edge2->PrevInSEL;
      if (pTVar2 != (TEdge *)0x0) {
        pTVar2->NextInSEL = Edge1;
      }
      Edge1->PrevInSEL = pTVar2;
      Edge1->NextInSEL = Edge2;
      Edge2->PrevInSEL = Edge1;
      Edge2->NextInSEL = pTVar1;
    }
    else {
      pTVar1 = Edge1->NextInSEL;
      pTVar2 = Edge1->PrevInSEL;
      Edge1->NextInSEL = Edge2->NextInSEL;
      if (Edge1->NextInSEL != (TEdge *)0x0) {
        Edge1->NextInSEL->PrevInSEL = Edge1;
      }
      Edge1->PrevInSEL = Edge2->PrevInSEL;
      if (Edge1->PrevInSEL != (TEdge *)0x0) {
        Edge1->PrevInSEL->NextInSEL = Edge1;
      }
      Edge2->NextInSEL = pTVar1;
      if (Edge2->NextInSEL != (TEdge *)0x0) {
        Edge2->NextInSEL->PrevInSEL = Edge2;
      }
      Edge2->PrevInSEL = pTVar2;
      if (Edge2->PrevInSEL != (TEdge *)0x0) {
        Edge2->PrevInSEL->NextInSEL = Edge2;
      }
    }
    if (Edge1->PrevInSEL == (TEdge *)0x0) {
      this->m_SortedEdges = Edge1;
    }
    else if (Edge2->PrevInSEL == (TEdge *)0x0) {
      this->m_SortedEdges = Edge2;
    }
  }
  return;
}

Assistant:

void Clipper::SwapPositionsInSEL(TEdge *Edge1, TEdge *Edge2)
{
  if(  !( Edge1->NextInSEL ) &&  !( Edge1->PrevInSEL ) ) return;
  if(  !( Edge2->NextInSEL ) &&  !( Edge2->PrevInSEL ) ) return;

  if(  Edge1->NextInSEL == Edge2 )
  {
    TEdge* Next = Edge2->NextInSEL;
    if( Next ) Next->PrevInSEL = Edge1;
    TEdge* Prev = Edge1->PrevInSEL;
    if( Prev ) Prev->NextInSEL = Edge2;
    Edge2->PrevInSEL = Prev;
    Edge2->NextInSEL = Edge1;
    Edge1->PrevInSEL = Edge2;
    Edge1->NextInSEL = Next;
  }
  else if(  Edge2->NextInSEL == Edge1 )
  {
    TEdge* Next = Edge1->NextInSEL;
    if( Next ) Next->PrevInSEL = Edge2;
    TEdge* Prev = Edge2->PrevInSEL;
    if( Prev ) Prev->NextInSEL = Edge1;
    Edge1->PrevInSEL = Prev;
    Edge1->NextInSEL = Edge2;
    Edge2->PrevInSEL = Edge1;
    Edge2->NextInSEL = Next;
  }
  else
  {
    TEdge* Next = Edge1->NextInSEL;
    TEdge* Prev = Edge1->PrevInSEL;
    Edge1->NextInSEL = Edge2->NextInSEL;
    if( Edge1->NextInSEL ) Edge1->NextInSEL->PrevInSEL = Edge1;
    Edge1->PrevInSEL = Edge2->PrevInSEL;
    if( Edge1->PrevInSEL ) Edge1->PrevInSEL->NextInSEL = Edge1;
    Edge2->NextInSEL = Next;
    if( Edge2->NextInSEL ) Edge2->NextInSEL->PrevInSEL = Edge2;
    Edge2->PrevInSEL = Prev;
    if( Edge2->PrevInSEL ) Edge2->PrevInSEL->NextInSEL = Edge2;
  }

  if( !Edge1->PrevInSEL ) m_SortedEdges = Edge1;
  else if( !Edge2->PrevInSEL ) m_SortedEdges = Edge2;
}